

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O3

bool __thiscall QHstsHeaderParser::parse(QHstsHeaderParser *this,QHttpHeaders *headers)

{
  undefined8 uVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  QDateTime aQStack_48 [8];
  undefined8 local_40;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QHttpHeaders::values((QList<QByteArray> *)&local_38,headers,StrictTransportSecurity);
  iVar3 = QList<QByteArray>::begin((QList<QByteArray> *)&local_38);
  iVar4 = QList<QByteArray>::end((QList<QByteArray> *)&local_38);
  do {
    if (iVar3.i == iVar4.i) {
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
      this->subDomainsFound = false;
      bVar2 = false;
LAB_00173182:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return bVar2;
      }
      __stack_chk_fail();
    }
    QByteArray::operator=(&this->header,iVar3.i);
    bVar2 = parseSTSHeader(this);
    if ((bVar2) && (this->maxAgeFound != false)) {
      QDateTime::currentDateTimeUtc();
      QDateTime::addSecs((longlong)&local_40);
      uVar1 = *(undefined8 *)&this->expiry;
      *(undefined8 *)&this->expiry = local_40;
      local_40 = uVar1;
      QDateTime::~QDateTime((QDateTime *)&local_40);
      QDateTime::~QDateTime(aQStack_48);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
      bVar2 = true;
      goto LAB_00173182;
    }
    iVar3.i = iVar3.i + 1;
  } while( true );
}

Assistant:

bool QHstsHeaderParser::parse(const QHttpHeaders &headers)
{
    for (const auto &value : headers.values(
                 QHttpHeaders::WellKnownHeader::StrictTransportSecurity)) {
        header = value;
        // RFC6797, 8.1:
        //
        //  The UA MUST ignore any STS header fields not conforming to the
        // grammar specified in Section 6.1 ("Strict-Transport-Security HTTP
        // Response Header Field").
        //
        // If a UA receives more than one STS header field in an HTTP
        // response message over secure transport, then the UA MUST process
        // only the first such header field.
        //
        // We read this as: ignore all invalid headers and take the first valid:
        if (parseSTSHeader() && maxAgeFound) {
            expiry = QDateTime::currentDateTimeUtc().addSecs(maxAge);
            return true;
        }
    }

    // In case it was set by a syntactically correct header (but without
    // REQUIRED max-age directive):
    subDomainsFound = false;

    return false;
}